

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chomp.c
# Opt level: O2

char * chomp(char *str)

{
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  
  if (str != (char *)0x0) {
    sVar1 = strlen(str);
    for (uVar3 = sVar1 & 0xffffffff;
        (uVar2 = (int)(uint)sVar1 >> 0x1f & (uint)sVar1, 0 < (int)(uint)uVar3 &&
        ((str[uVar3 - 1] == '\r' || (uVar2 = (uint)uVar3, str[uVar3 - 1] == '\n'))));
        uVar3 = uVar3 - 1) {
    }
    str[(int)uVar2] = '\0';
  }
  return str;
}

Assistant:

char *chomp(char *str)
{
    if (str) {
        int len = strlen(str);
        while (len > 0 && (str[len-1] == '\r' || str[len-1] == '\n'))
            len--;
        str[len] = '\0';
    }
    return str;
}